

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::CommandLineInterface::EnforceProtocEditionsSupport
          (CommandLineInterface *this,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *parsed_files)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppFVar2;
  FileDescriptor *this_00;
  pointer pcVar3;
  size_type sVar4;
  _Alloc_hider _Var5;
  size_type sVar6;
  bool bVar7;
  Edition edition;
  char *extraout_RDX;
  size_t in_R9;
  pointer ppFVar8;
  string_view filename;
  string_view format;
  string result;
  StringifySink local_c8;
  char *local_a8;
  long local_a0;
  char local_98;
  undefined7 uStack_97;
  StringifySink local_88;
  size_type local_68;
  pointer local_60;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  
  if (this->experimental_editions_ == false) {
    ppFVar2 = (parsed_files->
              super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    for (ppFVar8 = (parsed_files->
                   super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                   )._M_impl.super__Vector_impl_data._M_start; ppFVar8 != ppFVar2;
        ppFVar8 = ppFVar8 + 1) {
      this_00 = *ppFVar8;
      edition = FileDescriptor::edition(this_00);
      filename._M_str = extraout_RDX;
      filename._M_len = (size_t)(this_00->name_->_M_dataplus)._M_p;
      bVar7 = CanSkipEditionCheck((compiler *)this_00->name_->_M_string_length,filename);
      if ((1000 < (int)edition) && (!bVar7)) {
        pcVar3 = (this_00->name_->_M_dataplus)._M_p;
        sVar4 = this_00->name_->_M_string_length;
        local_c8.buffer_._M_dataplus._M_p = (pointer)&local_c8.buffer_.field_2;
        local_c8.buffer_.field_2._M_allocated_capacity = 0;
        local_c8.buffer_.field_2._8_8_ = 0;
        local_c8.buffer_._M_string_length = 0;
        AbslStringify<absl::lts_20250127::strings_internal::StringifySink>(&local_c8,edition);
        sVar6 = local_c8.buffer_._M_string_length;
        _Var5._M_p = local_c8.buffer_._M_dataplus._M_p;
        paVar1 = &local_88.buffer_.field_2;
        local_88.buffer_.field_2._M_allocated_capacity = 0;
        local_88.buffer_.field_2._8_8_ = 0;
        local_88.buffer_._M_string_length = 0;
        local_88.buffer_._M_dataplus._M_p = (pointer)paVar1;
        AbslStringify<absl::lts_20250127::strings_internal::StringifySink>(&local_88,EDITION_2023);
        local_a0 = 0;
        local_98 = '\0';
        local_58 = sVar6;
        local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)_Var5._M_p;
        local_48 = local_88.buffer_._M_string_length;
        local_40 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_88.buffer_._M_dataplus._M_p;
        format._M_str = (char *)&local_68;
        format._M_len =
             (size_t)
             "$0: is a file using edition $1, which is later than the protoc maximum supported edition $2."
        ;
        local_a8 = &local_98;
        local_68 = sVar4;
        local_60 = pcVar3;
        absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
                  ((substitute_internal *)&local_a8,(Nonnull<std::string_*>)0x5c,format,
                   (Nullable<const_absl::string_view_*>)0x3,in_R9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_a8,local_a0);
        if (local_a8 != &local_98) {
          operator_delete(local_a8,CONCAT71(uStack_97,local_98) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88.buffer_._M_dataplus._M_p != paVar1) {
          operator_delete(local_88.buffer_._M_dataplus._M_p,
                          local_88.buffer_.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8.buffer_._M_dataplus._M_p != &local_c8.buffer_.field_2) {
          operator_delete(local_c8.buffer_._M_dataplus._M_p,
                          local_c8.buffer_.field_2._M_allocated_capacity + 1);
        }
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool CommandLineInterface::EnforceProtocEditionsSupport(
    const std::vector<const FileDescriptor*>& parsed_files) const {
  if (experimental_editions_) {
    // The user has explicitly specified the experimental flag.
    return true;
  }
  for (const auto* fd : parsed_files) {
    Edition edition =
        ::google::protobuf::internal::InternalFeatureHelper::GetEdition(*fd);
    if (CanSkipEditionCheck(fd->name())) {
      // Legacy proto2/proto3 or exempted files don't need any checks.
      continue;
    }

    if (edition > ProtocMaximumEdition()) {
      std::cerr << absl::Substitute(
          "$0: is a file using edition $1, which is later than the protoc "
          "maximum supported edition $2.",
          fd->name(), edition, ProtocMaximumEdition());
      return false;
    }
  }
  return true;
}